

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_telemetry_messenger.c
# Opt level: O2

STRING_HANDLE
create_devices_and_modules_path
          (STRING_HANDLE iothub_host_fqdn,STRING_HANDLE device_id,STRING_HANDLE module_id)

{
  int iVar1;
  STRING_HANDLE handle;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  LOGGER_LOG p_Var5;
  
  handle = STRING_new();
  if (handle == (STRING_HANDLE)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return (STRING_HANDLE)0x0;
    }
    pcVar2 = "Failed creating devices_and_modules_path (STRING_new failed)";
    iVar1 = 0x95;
  }
  else {
    pcVar2 = STRING_c_str(iothub_host_fqdn);
    pcVar3 = STRING_c_str(device_id);
    pcVar4 = STRING_c_str(module_id);
    if (pcVar4 == (char *)0x0) {
      iVar1 = STRING_sprintf(handle,"%s/devices/%s",pcVar2,pcVar3);
      if (iVar1 == 0) {
        return handle;
      }
      STRING_delete(handle);
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) {
        return (STRING_HANDLE)0x0;
      }
      pcVar2 = "Failed creating devices_and_modules_path (STRING_sprintf failed)";
      iVar1 = 0xac;
    }
    else {
      iVar1 = STRING_sprintf(handle,"%s/devices/%s/modules/%s",pcVar2,pcVar3,pcVar4);
      if (iVar1 == 0) {
        return handle;
      }
      STRING_delete(handle);
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) {
        return (STRING_HANDLE)0x0;
      }
      pcVar2 = "Failed creating devices_and_modules_path (STRING_sprintf failed)";
      iVar1 = 0xa3;
    }
  }
  (*p_Var5)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_telemetry_messenger.c"
            ,"create_devices_and_modules_path",iVar1,1,pcVar2);
  return (STRING_HANDLE)0x0;
}

Assistant:

static STRING_HANDLE create_devices_and_modules_path(STRING_HANDLE iothub_host_fqdn, STRING_HANDLE device_id, STRING_HANDLE module_id)
{
    STRING_HANDLE devices_and_modules_path;

    if ((devices_and_modules_path = STRING_new()) == NULL)
    {
        LogError("Failed creating devices_and_modules_path (STRING_new failed)");
    }
    else
    {
        const char* iothub_host_fqdn_char_ptr = STRING_c_str(iothub_host_fqdn);
        const char* device_id_char_ptr = STRING_c_str(device_id);
        const char* module_id_char_ptr = STRING_c_str(module_id);

        if (module_id_char_ptr != NULL)
        {
            if (STRING_sprintf(devices_and_modules_path, IOTHUB_DEVICES_MODULE_PATH_FMT, iothub_host_fqdn_char_ptr, device_id_char_ptr, module_id_char_ptr) != RESULT_OK)
            {
                STRING_delete(devices_and_modules_path);
                devices_and_modules_path = NULL;
                LogError("Failed creating devices_and_modules_path (STRING_sprintf failed)");
            }
        }
        else
        {
            if (STRING_sprintf(devices_and_modules_path, IOTHUB_DEVICES_PATH_FMT, iothub_host_fqdn_char_ptr, device_id_char_ptr) != RESULT_OK)
            {
                STRING_delete(devices_and_modules_path);
                devices_and_modules_path = NULL;
                LogError("Failed creating devices_and_modules_path (STRING_sprintf failed)");
            }
        }
    }

    return devices_and_modules_path;
}